

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mesh.hpp
# Opt level: O0

HydroProp * __thiscall OpenMD::Mesh::getHydroProp(Mesh *this,RealType viscosity)

{
  HydroProp *this_00;
  HydroProp *props;
  Vector3d *in_stack_ffffffffffffffa8;
  HydroProp *this_01;
  HydroProp *in_stack_ffffffffffffffd0;
  
  this_00 = (HydroProp *)operator_new(0x280);
  HydroProp::HydroProp(in_stack_ffffffffffffffd0);
  this_01 = this_00;
  Vector3<double>::Vector3((Vector3<double> *)this_00,in_stack_ffffffffffffffa8);
  HydroProp::setCenterOfResistance(this_01,in_stack_ffffffffffffffa8);
  snprintf(painCave.errMsg,2000,"Mesh was asked to return an analytic HydroProps.\n");
  painCave.severity = 1;
  painCave.isFatal = 1;
  simError();
  return this_00;
}

Assistant:

virtual HydroProp* getHydroProp(RealType viscosity) {
      HydroProp* props = new HydroProp();
      props->setCenterOfResistance(V3Zero);
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Mesh was asked to return an analytic HydroProps.\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
      return props;
    }